

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::
KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
::MatchAndExplain(KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
                  *this,pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        *key_value,MatchResultListener *listener)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *x;
  ulong uVar2;
  MatchResultListener *this_00;
  undefined1 local_1f0 [8];
  string explanation;
  undefined1 local_1b8 [7];
  bool match;
  StringMatchResultListener inner_listener;
  MatchResultListener *listener_local;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *key_value_local;
  KeyMatcherImpl<const_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_&>
  *this_local;
  
  inner_listener._400_8_ = listener;
  StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_1b8);
  x = pair_getters::
      First<std::pair<std::__cxx11::string_const,std::vector<unsigned_char,std::allocator<unsigned_char>>>const>
                (key_value);
  bVar1 = MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::MatchAndExplain(&(this->inner_matcher_).
                             super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                            ,x,(MatchResultListener *)local_1b8);
  StringMatchResultListener::str_abi_cxx11_
            ((string *)local_1f0,(StringMatchResultListener *)local_1b8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    this_00 = MatchResultListener::operator<<
                        ((MatchResultListener *)inner_listener._400_8_,
                         (char (*) [30])"whose first field is a value ");
    MatchResultListener::operator<<
              (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1f0);
  }
  std::__cxx11::string::~string((string *)local_1f0);
  StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_1b8);
  return bVar1;
}

Assistant:

bool MatchAndExplain(PairType key_value,
                       MatchResultListener* listener) const override {
    StringMatchResultListener inner_listener;
    const bool match = inner_matcher_.MatchAndExplain(
        pair_getters::First(key_value, Rank1()), &inner_listener);
    const std::string explanation = inner_listener.str();
    if (!explanation.empty()) {
      *listener << "whose first field is a value " << explanation;
    }
    return match;
  }